

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MethodBuilder.cpp
# Opt level: O0

size_t __thiscall Lodtalk::MethodAssembler::Assembler::addLiteral(Assembler *this,Oop newLiteral)

{
  size_type sVar1;
  bool bVar2;
  size_type sVar3;
  reference this_00;
  OopRef local_50;
  size_type local_30;
  size_type ret;
  size_t i;
  Assembler *this_local;
  Oop newLiteral_local;
  
  ret = 0;
  i = (size_t)this;
  this_local = (Assembler *)newLiteral.field_0;
  while( true ) {
    sVar1 = ret;
    sVar3 = std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::size(&this->literals);
    if (sVar3 <= sVar1) {
      local_30 = std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::size
                           (&this->literals);
      OopRef::OopRef(&local_50,(Oop *)&this_local);
      std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::push_back
                (&this->literals,&local_50);
      OopRef::~OopRef(&local_50);
      return local_30;
    }
    this_00 = std::vector<Lodtalk::OopRef,_std::allocator<Lodtalk::OopRef>_>::operator[]
                        (&this->literals,ret);
    bVar2 = OopRef::operator==(this_00,(Oop *)&this_local);
    if (bVar2) break;
    ret = ret + 1;
  }
  return ret;
}

Assistant:

size_t Assembler::addLiteral(Oop newLiteral)
{
	for (size_t i = 0; i < literals.size(); ++i)
	{
		if(literals[i] == newLiteral)
			return i;
	}

	auto ret = literals.size();
	literals.push_back(newLiteral);
	return ret;
}